

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_hash nk_murmur_hash(void *key,int len,nk_hash seed)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  int local_58;
  uint local_54;
  int i;
  nk_uint k1;
  nk_uint *blocks;
  nk_byte *tail;
  nk_uint c2;
  nk_uint c1;
  nk_uint h1;
  int nblocks;
  nk_byte *data;
  anon_union_8_2_94730028 conv;
  nk_hash seed_local;
  int len_local;
  void *key_local;
  
  conv._0_4_ = seed;
  conv._4_4_ = len;
  _seed_local = key;
  memset(&data,0,8);
  iVar2 = (int)conv._4_4_ / 4;
  c2 = conv._0_4_;
  if (_seed_local == (void *)0x0) {
    return 0;
  }
  for (local_58 = -iVar2; local_58 != 0; local_58 = local_58 + 1) {
    iVar1 = *(int *)((long)_seed_local + (long)local_58 * 4 + (long)(iVar2 << 2));
    uVar3 = (iVar1 * 0x16a88000 | (uint)(iVar1 * -0x3361d2af) >> 0x11) * 0x1b873593 ^ c2;
    c2 = (uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64;
  }
  pbVar4 = (byte *)((long)_seed_local + (long)(iVar2 << 2));
  local_54 = 0;
  uVar3 = conv._4_4_ & 3;
  if (uVar3 != 1) {
    if (uVar3 != 2) {
      if (uVar3 != 3) goto LAB_0011c0ad;
      local_54 = (uint)pbVar4[2] << 0x10;
    }
    local_54 = (uint)pbVar4[1] << 8 ^ local_54;
  }
  c2 = ((*pbVar4 ^ local_54) * 0x16a88000 | (*pbVar4 ^ local_54) * -0x3361d2af >> 0x11) * 0x1b873593
       ^ c2;
LAB_0011c0ad:
  uVar3 = ((conv._4_4_ ^ c2) >> 0x10 ^ conv._4_4_ ^ c2) * -0x7a143595;
  uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
  return uVar3 >> 0x10 ^ uVar3;
}

Assistant:

NK_API nk_hash
nk_murmur_hash(const void * key, int len, nk_hash seed)
{
    /* 32-Bit MurmurHash3: https://code.google.com/p/smhasher/wiki/MurmurHash3*/
    #define NK_ROTL(x,r) ((x) << (r) | ((x) >> (32 - r)))
    union {const nk_uint *i; const nk_byte *b;} conv = {0};
    const nk_byte *data = (const nk_byte*)key;
    const int nblocks = len/4;
    nk_uint h1 = seed;
    const nk_uint c1 = 0xcc9e2d51;
    const nk_uint c2 = 0x1b873593;
    const nk_byte *tail;
    const nk_uint *blocks;
    nk_uint k1;
    int i;

    /* body */
    if (!key) return 0;
    conv.b = (data + nblocks*4);
    blocks = (const nk_uint*)conv.i;
    for (i = -nblocks; i; ++i) {
        k1 = blocks[i];
        k1 *= c1;
        k1 = NK_ROTL(k1,15);
        k1 *= c2;

        h1 ^= k1;
        h1 = NK_ROTL(h1,13);
        h1 = h1*5+0xe6546b64;
    }

    /* tail */
    tail = (const nk_byte*)(data + nblocks*4);
    k1 = 0;
    switch (len & 3) {
    case 3: k1 ^= (nk_uint)(tail[2] << 16); /* fallthrough */
    case 2: k1 ^= (nk_uint)(tail[1] << 8u); /* fallthrough */
    case 1: k1 ^= tail[0];
            k1 *= c1;
            k1 = NK_ROTL(k1,15);
            k1 *= c2;
            h1 ^= k1;
            break;
    default: break;
    }

    /* finalization */
    h1 ^= (nk_uint)len;
    /* fmix32 */
    h1 ^= h1 >> 16;
    h1 *= 0x85ebca6b;
    h1 ^= h1 >> 13;
    h1 *= 0xc2b2ae35;
    h1 ^= h1 >> 16;

    #undef NK_ROTL
    return h1;
}